

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

void fft(float *in,int N,float *out)

{
  float *in_00;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int n;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  uVar7 = (ulong)(uint)N;
  while( true ) {
    iVar6 = (int)uVar7;
    if (iVar6 == 1) {
      *out = *in;
      out[1] = 0.0;
      return;
    }
    uVar5 = (int)(uVar7 >> 0x1f) + iVar6;
    if (iVar6 - (uVar5 & 0xfffffffe) == 1) break;
    uVar5 = (int)uVar5 >> 1;
    in_00 = in + iVar6;
    if (iVar6 < 2) {
      uVar2 = (ulong)(iVar6 * 2);
      fft(in_00,uVar5,out + uVar2);
    }
    else {
      uVar11 = (ulong)uVar5;
      uVar2 = 0;
      do {
        in[(long)iVar6 + uVar2] = in[uVar2 * 2];
        uVar2 = uVar2 + 1;
      } while (uVar11 != uVar2);
      uVar2 = (ulong)(uint)(iVar6 * 2);
      fft(in_00,uVar5,out + uVar2);
      if (1 < iVar6) {
        uVar3 = 0;
        do {
          in[(long)iVar6 + uVar3] = in[uVar3 * 2 + 1];
          uVar3 = uVar3 + 1;
        } while (uVar11 != uVar3);
        fft(in_00,uVar5,out + uVar2 + iVar6);
        if (iVar6 < 2) {
          return;
        }
        lVar4 = 0;
        lVar8 = 0;
        do {
          lVar10 = lVar8 * (400 / uVar7);
          fVar12 = (float)(&(anonymous_namespace)::global_cache)[lVar10];
          fVar13 = (float)*(undefined8 *)(out + (long)iVar6 + uVar2);
          fVar17 = (float)(&DAT_00170460)[lVar10] * fVar13;
          fVar14 = (float)((ulong)*(undefined8 *)(out + (long)iVar6 + uVar2) >> 0x20);
          fVar18 = (float)(&DAT_00170460)[lVar10] * fVar14;
          fVar15 = (float)*(undefined8 *)(out + uVar2);
          fVar16 = (float)((ulong)*(undefined8 *)(out + uVar2) >> 0x20);
          *(ulong *)out =
               CONCAT44(-fVar12 * fVar13 + fVar18 + fVar16,fVar12 * fVar14 + fVar17 + fVar15);
          *(ulong *)(out + uVar11 * 2) =
               CONCAT44(fVar12 * fVar13 + (fVar16 - fVar18),-fVar12 * fVar14 + (fVar15 - fVar17));
          lVar8 = lVar8 + 1;
          out = out + 2;
          lVar4 = lVar4 + 8;
        } while (uVar11 * 8 != lVar4);
        return;
      }
    }
    out = out + uVar2 + (long)iVar6;
    uVar7 = (ulong)uVar5;
    in = in_00;
  }
  iVar1 = 0;
  if (iVar6 < 1) {
    return;
  }
  uVar2 = 0;
  do {
    fVar12 = 0.0;
    fVar13 = 0.0;
    iVar9 = 0;
    uVar11 = 0;
    do {
      fVar12 = fVar12 + (float)(&DAT_00170460)[iVar9 % 400] * in[uVar11];
      fVar13 = fVar13 + (float)(&(anonymous_namespace)::global_cache)[iVar9 % 400] * -in[uVar11];
      uVar11 = uVar11 + 1;
      iVar9 = iVar9 + iVar1;
    } while (uVar7 != uVar11);
    *(ulong *)(out + uVar2 * 2) = CONCAT44(fVar13,fVar12);
    uVar2 = uVar2 + 1;
    iVar1 = iVar1 + (int)(400 / (long)iVar6);
  } while (uVar2 != uVar7);
  return;
}

Assistant:

static void fft(float* in, int N, float* out) {
    if (N == 1) {
        out[0] = in[0];
        out[1] = 0;
        return;
    }

    const int half_N = N / 2;
    if (N - half_N*2 == 1) {
        dft(in, N, out);
        return;
    }

    float* even = in + N;
    for (int i = 0; i < half_N; ++i) {
        even[i]= in[2*i];
    }
    float* even_fft = out + 2 * N;
    fft(even, half_N, even_fft);

    float* odd = even;
    for (int i = 0; i < half_N; ++i) {
        odd[i] = in[2*i + 1];
    }
    float* odd_fft = even_fft + N;
    fft(odd, half_N, odd_fft);

    const int sin_cos_step = SIN_COS_N_COUNT / N;
    for (int k = 0; k < half_N; k++) {
        int idx = k * sin_cos_step; // t = 2*M_PI*k/N
        float re = global_cache.cos_vals[idx]; // cos(t)
        float im = -global_cache.sin_vals[idx]; // sin(t)

        float re_odd = odd_fft[2*k + 0];
        float im_odd = odd_fft[2*k + 1];

        out[2*k + 0] = even_fft[2*k + 0] + re*re_odd - im*im_odd;
        out[2*k + 1] = even_fft[2*k + 1] + re*im_odd + im*re_odd;

        out[2*(k + half_N) + 0] = even_fft[2*k + 0] - re*re_odd + im*im_odd;
        out[2*(k + half_N) + 1] = even_fft[2*k + 1] - re*im_odd - im*re_odd;
    }
}